

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall
HDWallet_AllowAnyMnemonicTest_Test::TestBody(HDWallet_AllowAnyMnemonicTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_;
  Message local_160;
  ByteData local_158;
  AssertHelper local_140;
  Message local_138;
  string local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  HDWallet local_f8;
  AssertHelper local_e0;
  Message local_d8;
  ByteData local_d0;
  AssertHelper local_b8;
  Message local_b0 [2];
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  HDWallet local_68;
  undefined1 local_50 [8];
  ByteData actual_seed;
  undefined1 local_28 [8];
  HDWallet hd_wallet;
  HDWallet_AllowAnyMnemonicTest_Test *this_local;
  
  hd_wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::HDWallet::HDWallet((HDWallet *)local_28);
  cfd::core::ByteData::ByteData((ByteData *)local_50);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,&empty_mnemonic_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_a0,(string *)&test_passphrase_abi_cxx11_);
      cfd::core::HDWallet::HDWallet(&local_68,&local_80,&local_a0,false);
      cfd::core::HDWallet::operator=((HDWallet *)local_28,&local_68);
      cfd::core::HDWallet::~HDWallet(&local_68);
      std::__cxx11::string::~string((string *)&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
    }
  }
  else {
    testing::Message::Message(local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hdwallet.cpp"
               ,0xd8,
               "Expected: hd_wallet = HDWallet(empty_mnemonic, test_passphrase) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(local_b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GetSeed(&local_d0,(HDWallet *)local_28);
      cfd::core::ByteData::operator=((ByteData *)local_50,&local_d0);
      cfd::core::ByteData::~ByteData(&local_d0);
    }
  }
  else {
    testing::Message::Message(&local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hdwallet.cpp"
               ,0xd9,
               "Expected: actual_seed = hd_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_110,&invalid_words_mnemonic_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_130,(string *)&test_passphrase_abi_cxx11_);
      cfd::core::HDWallet::HDWallet(&local_f8,&local_110,&local_130,false);
      cfd::core::HDWallet::operator=((HDWallet *)local_28,&local_f8);
      cfd::core::HDWallet::~HDWallet(&local_f8);
      std::__cxx11::string::~string((string *)&local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
    }
  }
  else {
    testing::Message::Message(&local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hdwallet.cpp"
               ,0xdc,
               "Expected: hd_wallet = HDWallet(invalid_words_mnemonic, test_passphrase) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GetSeed(&local_158,(HDWallet *)local_28);
      cfd::core::ByteData::operator=((ByteData *)local_50,&local_158);
      cfd::core::ByteData::~ByteData(&local_158);
    }
  }
  else {
    testing::Message::Message(&local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hdwallet.cpp"
               ,0xdd,
               "Expected: actual_seed = hd_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_160);
  }
  cfd::core::ByteData::~ByteData((ByteData *)local_50);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_28);
  return;
}

Assistant:

TEST(HDWallet, AllowAnyMnemonicTest) {
  try {
    HDWallet hd_wallet;
    ByteData actual_seed;
    // check empty mnemonic
    EXPECT_NO_THROW(hd_wallet = HDWallet(empty_mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());

    // check invalid mnemonic
    EXPECT_NO_THROW(hd_wallet = HDWallet(invalid_words_mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }
}